

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O2

MetadataResult RunShellCommand(ShellState *state,char **azArg,idx_t nArg)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  MetadataResult MVar4;
  char *pcVar5;
  char *zFormat;
  idx_t i;
  idx_t iVar6;
  
  if (safe_mode == '\x01') {
    fwrite(".sh/.system cannot be used in -safe mode\n",0x29,1,_stderr);
    MVar4 = FAIL;
  }
  else {
    MVar4 = PRINT_USAGE;
    if (1 < nArg) {
      pcVar3 = azArg[1];
      pcVar2 = strchr(pcVar3,0x20);
      pcVar5 = "\"%s\"";
      if (pcVar2 == (char *)0x0) {
        pcVar5 = "%s";
      }
      pcVar3 = duckdb_shell_sqlite3_mprintf(pcVar5,pcVar3);
      for (iVar6 = 2; nArg != iVar6; iVar6 = iVar6 + 1) {
        pcVar2 = azArg[iVar6];
        pcVar5 = strchr(pcVar2,0x20);
        zFormat = "%z \"%s\"";
        if (pcVar5 == (char *)0x0) {
          zFormat = "%z %s";
        }
        pcVar3 = duckdb_shell_sqlite3_mprintf(zFormat,pcVar3,pcVar2);
      }
      uVar1 = system(pcVar3);
      duckdb_shell_sqlite3_free(pcVar3);
      if (uVar1 == 0) {
        MVar4 = SUCCESS;
      }
      else {
        MVar4 = SUCCESS;
        fprintf(_stderr,"System command returns %d\n",(ulong)uVar1);
      }
    }
  }
  return MVar4;
}

Assistant:

MetadataResult RunShellCommand(ShellState &state, const char **azArg, idx_t nArg) {
	if (safe_mode) {
		utf8_printf(stderr, ".sh/.system cannot be used in -safe mode\n");
		return MetadataResult::FAIL;
	}
	char *zCmd;
	int x;
	if (nArg < 2) {
		return MetadataResult::PRINT_USAGE;
	}
	zCmd = sqlite3_mprintf(strchr(azArg[1], ' ') == 0 ? "%s" : "\"%s\"", azArg[1]);
	for (idx_t i = 2; i < nArg; i++) {
		zCmd = sqlite3_mprintf(strchr(azArg[i], ' ') == 0 ? "%z %s" : "%z \"%s\"", zCmd, azArg[i]);
	}
	x = system(zCmd);
	sqlite3_free(zCmd);
	if (x) {
		raw_printf(stderr, "System command returns %d\n", x);
	}
	return MetadataResult::SUCCESS;
}